

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

void __thiscall CLI::Option::_reduce_results(Option *this,results_t *res,results_t *original)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ArgumentMismatch *pAVar5;
  string *delim;
  pointer pbVar6;
  int iVar7;
  pointer pbVar8;
  undefined1 local_a8 [32];
  string local_88;
  string local_68;
  string local_48;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(res);
  switch((this->super_OptionBase<CLI::Option>).multi_option_policy_) {
  case TakeLast:
    uVar2 = get_items_expected_max(this);
    uVar4 = 1;
    if (1 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    pbVar6 = (original->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (uVar4 < (ulong)((long)pbVar6 -
                        (long)(original->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
      pbVar8 = pbVar6 + -uVar4;
LAB_0010bb33:
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,pbVar8,
                 pbVar6);
      return;
    }
    break;
  case TakeFirst:
    uVar2 = get_items_expected_max(this);
    uVar4 = 1;
    if (1 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    pbVar8 = (original->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar4 < (ulong)((long)(original->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)) {
      pbVar6 = pbVar8 + uVar4;
      goto LAB_0010bb33;
    }
    break;
  case Join:
    if (0x20 < (ulong)((long)(this->results_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->results_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      bVar1 = (this->super_OptionBase<CLI::Option>).delimiter_;
      delim = (string *)0xa;
      if (bVar1 != 0) {
        delim = (string *)(ulong)bVar1;
      }
      local_a8._0_8_ = local_a8 + 0x10;
      ::std::__cxx11::string::_M_construct((ulong)local_a8,'\x01');
      detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_88,(detail *)original,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8,delim);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,&local_88)
      ;
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)local_a8);
    }
    break;
  case TakeAll:
    break;
  default:
    iVar7 = this->expected_min_ * this->type_size_min_;
    iVar3 = get_items_expected_max(this);
    iVar7 = iVar7 + (uint)(iVar7 == 0);
    iVar3 = iVar3 + (uint)(iVar3 == 0);
    uVar4 = (long)(original->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(original->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar4 < (ulong)(long)iVar7) {
      pAVar5 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(&local_48,this,false,false);
      ArgumentMismatch::AtLeast
                (pAVar5,&local_48,iVar7,
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5);
      __cxa_throw(pAVar5,&ArgumentMismatch::typeinfo,Error::~Error);
    }
    if ((ulong)(long)iVar3 < uVar4) {
      pAVar5 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(&local_68,this,false,false);
      ArgumentMismatch::AtMost
                (pAVar5,&local_68,iVar3,
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5);
      __cxa_throw(pAVar5,&ArgumentMismatch::typeinfo,Error::~Error);
    }
  }
  return;
}

Assistant:

void _reduce_results(results_t &res, const results_t &original) const {

        // max num items expected or length of vector, always at least 1
        // Only valid for a trimming policy

        res.clear();
        // Operation depends on the policy setting
        switch(multi_option_policy_) {
        case MultiOptionPolicy::TakeAll:
            break;
        case MultiOptionPolicy::TakeLast: {
            // Allow multi-option sizes (including 0)
            std::size_t trim_size = std::min<std::size_t>(
                static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
            if(original.size() != trim_size) {
                res.assign(original.end() - static_cast<results_t::difference_type>(trim_size), original.end());
            }
        } break;
        case MultiOptionPolicy::TakeFirst: {
            std::size_t trim_size = std::min<std::size_t>(
                static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
            if(original.size() != trim_size) {
                res.assign(original.begin(), original.begin() + static_cast<results_t::difference_type>(trim_size));
            }
        } break;
        case MultiOptionPolicy::Join:
            if(results_.size() > 1) {
                res.push_back(detail::join(original, std::string(1, (delimiter_ == '\0') ? '\n' : delimiter_)));
            }
            break;
        case MultiOptionPolicy::Throw:
        default: {
            auto num_min = static_cast<std::size_t>(get_items_expected_min());
            auto num_max = static_cast<std::size_t>(get_items_expected_max());
            if(num_min == 0) {
                num_min = 1;
            }
            if(num_max == 0) {
                num_max = 1;
            }
            if(original.size() < num_min) {
                throw ArgumentMismatch::AtLeast(get_name(), static_cast<int>(num_min), original.size());
            }
            if(original.size() > num_max) {
                throw ArgumentMismatch::AtMost(get_name(), static_cast<int>(num_max), original.size());
            }
            break;
        }
        }
    }